

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void __thiscall
ChainTestingSetup::ChainTestingSetup(ChainTestingSetup *this,ChainType chainType,TestOpts *opts)

{
  long lVar1;
  CChainParams *pCVar2;
  atomic<int> *__args_1;
  Warnings *__args_2;
  type this_00;
  long in_RDX;
  undefined4 in_ESI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  CChainParams *chainparams;
  bilingual_str error;
  bilingual_str *in_stack_fffffffffffffdb8;
  TestOpts *in_stack_fffffffffffffdc0;
  anon_class_48_3_a4e8b50c *__f;
  TestOpts *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  CScheduler *in_stack_fffffffffffffde0;
  type *in_stack_fffffffffffffde8;
  int line;
  char (*in_stack_fffffffffffffdf0) [10];
  SignalInterrupt *__args;
  unique_ptr<SerialTaskRunner,_std::default_delete<SerialTaskRunner>_> *in_stack_fffffffffffffdf8;
  unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *val;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  NodeContext *in_stack_fffffffffffffe08;
  size_type *n_indexes;
  CChainParams *args;
  undefined4 in_stack_fffffffffffffe50;
  anon_class_48_3_a4e8b50c local_170;
  SignalInterrupt local_140;
  undefined1 local_131;
  unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> local_130 [7];
  CChainParams *local_f8;
  TestOpts *in_stack_ffffffffffffff40;
  ChainType in_stack_ffffffffffffff4c;
  BasicTestingSetup *in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestOpts::TestOpts(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  BasicTestingSetup::BasicTestingSetup
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
  TestOpts::~TestOpts((TestOpts *)in_stack_fffffffffffffdb8);
  *(undefined8 *)((long)&in_RDI[0x10].translated.field_2 + 8) = 0;
  in_RDI[0x11].original._M_dataplus._M_p = (pointer)0x0;
  in_RDI[0x11].original._M_string_length = 0;
  in_RDI[0x11].original.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[0x11].original.field_2 + 8) = 0;
  *(undefined1 *)&in_RDI[0x11].translated._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&in_RDI[0x11].translated._M_dataplus._M_p + 1) = 1;
  n_indexes = &in_RDI[0x11].translated._M_string_length;
  std::function<void_()>::function((function<void_()> *)in_stack_fffffffffffffdb8);
  pCVar2 = Params();
  args = pCVar2;
  if ((*(byte *)(in_RDX + 0x1b) & 1) != 0) {
    std::make_unique<CScheduler>();
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::operator=
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)in_stack_fffffffffffffdc8
               ,(unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)
                in_stack_fffffffffffffdc0);
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::~unique_ptr
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)in_stack_fffffffffffffdc8
              );
    std::thread::
    thread<void(&)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[10],ChainTestingSetup::ChainTestingSetup(ChainType,TestOpts)::__1,void>
              ((thread *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> *)
               in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::operator->
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)in_stack_fffffffffffffdb8
              );
    in_stack_fffffffffffffe08 = (NodeContext *)(local_130 + 4);
    std::thread::operator=((thread *)in_stack_fffffffffffffdc8,(thread *)in_stack_fffffffffffffdc0);
    std::thread::~thread((thread *)in_stack_fffffffffffffdb8);
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::operator*
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)in_stack_fffffffffffffdc8
              );
    std::make_unique<SerialTaskRunner,CScheduler&>(in_stack_fffffffffffffde0);
    std::
    make_unique<ValidationSignals,std::unique_ptr<SerialTaskRunner,std::default_delete<SerialTaskRunner>>>
              (in_stack_fffffffffffffdf8);
    std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator=
              ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               in_stack_fffffffffffffdc8,
               (unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               in_stack_fffffffffffffdc0);
    std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::~unique_ptr
              ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               in_stack_fffffffffffffdc8);
    std::unique_ptr<SerialTaskRunner,_std::default_delete<SerialTaskRunner>_>::~unique_ptr
              ((unique_ptr<SerialTaskRunner,_std::default_delete<SerialTaskRunner>_> *)
               in_stack_fffffffffffffdc8);
  }
  line = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  std::__cxx11::string::string(in_stack_fffffffffffffdd0);
  std::__cxx11::string::string(in_stack_fffffffffffffdd0);
  MemPoolOptionsForTest(in_stack_fffffffffffffe08);
  std::make_unique<CTxMemPool,kernel::MemPoolOptions,bilingual_str&>
            ((MemPoolOptions *)CONCAT44(in_ESI,in_stack_fffffffffffffe50),in_RDI);
  val = local_130;
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator=
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffffdc8,
             (unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffffdc0);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::~unique_ptr
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffffdc8);
  local_131 = bilingual_str::empty(in_stack_fffffffffffffdb8);
  inline_assertion_check<true,bool>
            ((bool *)val,*in_stack_fffffffffffffdf0,line,(char *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8);
  std::make_unique<node::Warnings>();
  __args = &local_140;
  std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator=
            ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
             in_stack_fffffffffffffdc8,
             (unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
             in_stack_fffffffffffffdc0);
  std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
            ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
             in_stack_fffffffffffffdc8);
  ::node::CalculateCacheSizes((ArgsManager *)args,(size_t)n_indexes);
  *(undefined8 *)((long)&in_RDI[0x11].original.field_2 + 8) = local_170.opts._24_8_;
  in_RDI[0x11].original._M_string_length =
       (size_type)
       local_170.opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[0x11].original.field_2._M_allocated_capacity =
       (size_type)
       local_170.opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  *(CChainParams **)((long)&in_RDI[0x10].translated.field_2 + 8) = local_170.chainparams;
  in_RDI[0x11].original._M_dataplus._M_p =
       (pointer)local_170.opts.extra_args.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  __args_1 = (atomic<int> *)
             inline_assertion_check<true,util::SignalInterrupt*&>
                       ((SignalInterrupt **)val,(char *)__args,line,
                        (char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  __args_2 = (Warnings *)
             inline_assertion_check<true,std::unique_ptr<node::Warnings,std::default_delete<node::Warnings>>&>
                       (val,(char *)__args,(int)((ulong)__args_1 >> 0x20),
                        (char *)in_stack_fffffffffffffde0,
                        in_RDI[3].translated.field_2._M_local_buf + 8);
  this_00 = std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator*
                      ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                       in_stack_fffffffffffffdc8);
  std::
  make_unique<node::KernelNotifications,util::SignalInterrupt&,std::atomic<int>&,node::Warnings&>
            (__args,__args_1,__args_2);
  __f = &local_170;
  std::unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>::
  operator=((unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
             *)this_00,
            (unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
             *)__f);
  std::unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>::
  ~unique_ptr((unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
               *)this_00);
  local_f8 = pCVar2;
  TestOpts::TestOpts((TestOpts *)this_00,(TestOpts *)__f);
  std::function<void()>::operator=((function<void_()> *)this_00,__f);
  ChainTestingSetup(ChainType,TestOpts)::$_0::~__0
            ((anon_class_48_3_a4e8b50c *)in_stack_fffffffffffffdb8);
  _GLOBAL__N_1::std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffffdb8);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffdb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainTestingSetup::ChainTestingSetup(const ChainType chainType, TestOpts opts)
    : BasicTestingSetup(chainType, opts)
{
    const CChainParams& chainparams = Params();

    // We have to run a scheduler thread to prevent ActivateBestChain
    // from blocking due to queue overrun.
    if (opts.setup_validation_interface) {
        m_node.scheduler = std::make_unique<CScheduler>();
        m_node.scheduler->m_service_thread = std::thread(util::TraceThread, "scheduler", [&] { m_node.scheduler->serviceQueue(); });
        m_node.validation_signals = std::make_unique<ValidationSignals>(std::make_unique<SerialTaskRunner>(*m_node.scheduler));
    }

    bilingual_str error{};
    m_node.mempool = std::make_unique<CTxMemPool>(MemPoolOptionsForTest(m_node), error);
    Assert(error.empty());
    m_node.warnings = std::make_unique<node::Warnings>();

    m_cache_sizes = CalculateCacheSizes(m_args);

    m_node.notifications = std::make_unique<KernelNotifications>(*Assert(m_node.shutdown), m_node.exit_status, *Assert(m_node.warnings));

    m_make_chainman = [this, &chainparams, opts] {
        Assert(!m_node.chainman);
        ChainstateManager::Options chainman_opts{
            .chainparams = chainparams,
            .datadir = m_args.GetDataDirNet(),
            .check_block_index = 1,
            .notifications = *m_node.notifications,
            .signals = m_node.validation_signals.get(),
            .worker_threads_num = 2,
        };
        if (opts.min_validation_cache) {
            chainman_opts.script_execution_cache_bytes = 0;
            chainman_opts.signature_cache_bytes = 0;
        }
        const BlockManager::Options blockman_opts{
            .chainparams = chainman_opts.chainparams,
            .blocks_dir = m_args.GetBlocksDirPath(),
            .notifications = chainman_opts.notifications,
        };
        m_node.chainman = std::make_unique<ChainstateManager>(*Assert(m_node.shutdown), chainman_opts, blockman_opts);
        LOCK(m_node.chainman->GetMutex());
        m_node.chainman->m_blockman.m_block_tree_db = std::make_unique<BlockTreeDB>(DBParams{
            .path = m_args.GetDataDirNet() / "blocks" / "index",
            .cache_bytes = static_cast<size_t>(m_cache_sizes.block_tree_db),
            .memory_only = true,
        });
    };
    m_make_chainman();
}